

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  long *plVar1;
  bool bVar2;
  WindowSystemEvent *e;
  _func_int **pp_Var3;
  
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
                      (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
                       args_11,args_12);
    return bVar2;
  }
  e = (WindowSystemEvent *)operator_new(0x98);
  e->type = Tablet;
  e->flags = 0;
  e->eventAccepted = true;
  if (args == (QWindow *)0x0) {
    e->flags = 2;
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    pp_Var3 = (_func_int **)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  e[1]._vptr_WindowSystemEvent = pp_Var3;
  *(QWindow **)&e[1].type = args;
  *(unsigned_long *)&e[1].eventAccepted = args_1;
  *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)&e[2]._vptr_WindowSystemEvent =
       args_12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
       super_QFlagsStorage<Qt::KeyboardModifier>.i;
  *(QPointingDevice **)&e[2].type = args_4;
  e->_vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d90b0;
  *(QFlagsStorageHelper<Qt::MouseButton,_4> *)&e[2].eventAccepted =
       args_5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i;
  e[3]._vptr_WindowSystemEvent = (_func_int **)args_2.xp;
  *(qreal *)&e[3].type = args_2.yp;
  *(qreal *)&e[3].eventAccepted = args_3.xp;
  e[4]._vptr_WindowSystemEvent = (_func_int **)args_3.yp;
  *(double *)&e[4].type = args_6;
  *(double *)&e[4].eventAccepted = args_7;
  e[5]._vptr_WindowSystemEvent = (_func_int **)args_8;
  *(double *)&e[5].type = args_9;
  *(double *)&e[5].eventAccepted = args_10;
  *(int *)&e[6]._vptr_WindowSystemEvent = args_11;
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,e);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}